

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new.cc
# Opt level: O2

void operator_delete(void *p,size_t size)

{
  PagemapEntry *entry;
  undefined1 *puVar1;
  ulong uVar2;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this;
  long lVar3;
  code *pcVar4;
  ulong uVar5;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *pDVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  BackendSlabMetadata *meta;
  undefined8 *in_FS_OFFSET;
  anon_class_8_1_8991fb9c local_28;
  
  pDVar6 = snmalloc::
           BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
           ::concretePagemap.body;
  uVar5 = (ulong)p >> 0xe;
  uVar2 = snmalloc::
          BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
          ::concretePagemap.body[uVar5].
          super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
          .super_MetaEntryBase.remote_and_sizeclass;
  if ((undefined1 *)(uVar2 & 0xffffffffffffff80) == (undefined1 *)0x0) {
    if (p == (void *)0x0) {
      return;
    }
  }
  else {
    uVar9 = (size - 1) + (ulong)(size == 0);
    if (size < 0xe001) {
      uVar10 = (ulong)(byte)(&snmalloc::sizeclass_lookup)[uVar9 >> 4] + 0x40;
    }
    else {
      uVar10 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> uVar10 == 0; uVar10 = uVar10 - 1) {
        }
      }
      uVar10 = uVar10 ^ 0x3f;
    }
    uVar7 = (uint)uVar2 & 0x7f;
    if ((p == (void *)0x0) || (uVar10 == uVar7)) {
      entry = snmalloc::
              BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
              ::concretePagemap.body + uVar5;
      this = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
             *in_FS_OFFSET;
      if (&this->remote_alloc ==
          (conditional_t<Config::Options_IsQueueInline,_RemoteAllocator,_RemoteAllocator_*> *)
          (uVar2 & 0xffffffffffffff80)) {
        if ((*(ulong *)(snmalloc::sizeclass_metadata + (ulong)(uVar7 << 5) + 8) & (ulong)p) *
            *(ulong *)(snmalloc::sizeclass_metadata + (ulong)(uVar7 << 5) + 0x18) <
            *(ulong *)(snmalloc::sizeclass_metadata + (ulong)(uVar7 << 5) + 0x18)) {
          uVar2 = (entry->
                  super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                  ).super_MetaEntryBase.meta;
          meta = (BackendSlabMetadata *)(uVar2 & 0xfffffffffffffffe);
          snmalloc::freelist::
          Builder<true,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
          ::add(&(meta->
                 super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                 ).free_queue,
                (BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                 )p,&snmalloc::freelist::Object::key_root,uVar2 >> 3,&this->entropy);
          puVar1 = &(meta->
                    super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                    ).free_queue.field_0x24;
          *(short *)puVar1 = *(short *)puVar1 + -1;
          if (*(short *)puVar1 != 0) {
            return;
          }
          snmalloc::
          Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
          dealloc_local_object_slow(this,(Alloc<void>)p,entry,meta);
          return;
        }
      }
      else if (-1 < (char)uVar2) {
        lVar3 = (this->remote_dealloc_cache).capacity;
        lVar8 = lVar3 - *(long *)(snmalloc::sizeclass_metadata + (uVar7 << 5));
        if (lVar8 != 0 && *(long *)(snmalloc::sizeclass_metadata + (uVar7 << 5)) <= lVar3) {
          local_28.this = &this->remote_dealloc_cache;
          (this->remote_dealloc_cache).capacity = lVar8;
          if (p != (void *)0x0) {
            *(undefined8 *)p = 0;
            *(undefined8 *)((long)p + 8) = 0;
            pDVar6 = snmalloc::
                     BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                     ::concretePagemap.body;
          }
          uVar2 = pDVar6[uVar5].
                  super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                  .super_MetaEntryBase.remote_and_sizeclass;
          if (p != (void *)0x0) {
            *(undefined8 *)p = 0;
            *(undefined8 *)((long)p + 8) = 0;
          }
          snmalloc::
          RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
          ::dealloc<11008UL>::anon_class_8_1_8991fb9c::operator()
                    (&local_28,uVar2 & 0xffffffffffffff80,(Alloc<RemoteMessage>)p);
          return;
        }
        snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
        ::dealloc_remote_slow<snmalloc::CheckInitPthread>(this,entry,(Alloc<void>)p);
        return;
      }
    }
  }
  pcVar4 = (code *)invalidInstructionException();
  (*pcVar4)();
}

Assistant:

void operator delete(void* p, size_t size) EXCEPTSPEC
{
  snmalloc::libc::free_sized(p, size);
}